

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O3

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetDomainsByAliases
          (Registry *this,StringArray *aAliases,DomainArray *aRet,StringArray *aUnresolved)

{
  size_t __n;
  bool bVar1;
  char cVar2;
  int iVar3;
  Status SVar4;
  pointer __x;
  DomainArray domains;
  DomainArray result;
  Domain dom;
  Domain pred;
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  local_108;
  StringArray *local_f0;
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  local_e8;
  vector<ot::commissioner::persistent_storage::Domain,std::allocator<ot::commissioner::persistent_storage::Domain>>
  *local_c8;
  pointer local_c0;
  undefined1 local_b8 [8];
  _Alloc_hider local_b0;
  char local_a0 [16];
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  char local_78 [32];
  _Alloc_hider local_58;
  char local_48 [24];
  
  local_108.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __x = (aAliases->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  local_c0 = (aAliases->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_f0 = aUnresolved;
  local_c8 = (vector<ot::commissioner::persistent_storage::Domain,std::allocator<ot::commissioner::persistent_storage::Domain>>
              *)aRet;
  if (__x != local_c0) {
    do {
      Domain::Domain((Domain *)local_b8);
      __n = __x->_M_string_length;
      if ((__n == DAT_002e2448) &&
         ((__n == 0 ||
          (iVar3 = bcmp((__x->_M_dataplus)._M_p,(anonymous_namespace)::ALIAS_THIS_abi_cxx11_,__n),
          iVar3 == 0)))) {
        Network::Network((Network *)local_90);
        SVar4 = GetCurrentNetwork(this,(Network *)local_90);
        if (SVar4 == kSuccess) {
          iVar3 = (*this->mStorage->_vptr_PersistentStorage[0xd])
                            (this->mStorage,local_90 + 4,(Domain *)local_b8);
          SVar4 = ((char)iVar3 != '\0') << 2;
          if ((char)iVar3 == '\x01') {
            SVar4 = kNotFound;
          }
        }
        if (local_58._M_p != local_48) {
          operator_delete(local_58._M_p);
        }
        if (local_88._M_p != local_78) {
          operator_delete(local_88._M_p);
        }
LAB_001deff1:
        iVar3 = 0;
        if (SVar4 == kSuccess) {
          std::
          vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
          ::push_back(&local_108,(Domain *)local_b8);
          SVar4 = kSuccess;
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_f0,__x);
        }
      }
      else {
        local_e8.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_e8.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Domain::Domain((Domain *)local_90);
        std::__cxx11::string::_M_assign((string *)&local_88);
        iVar3 = (*this->mStorage->_vptr_PersistentStorage[0x15])
                          (this->mStorage,(Network *)local_90,&local_e8);
        cVar2 = (char)iVar3;
        SVar4 = (cVar2 != '\0') << 2;
        if (cVar2 == '\x01') {
          SVar4 = kNotFound;
        }
        bVar1 = true;
        if (cVar2 == '\0') {
          if ((long)local_e8.
                    super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_e8.
                    super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x28) {
            local_b8._0_4_ =
                 ((local_e8.
                   super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                   ._M_impl.super__Vector_impl_data._M_start)->mId).mId;
            iVar3 = 0;
            std::__cxx11::string::_M_assign((string *)&local_b0);
            SVar4 = kSuccess;
          }
          else {
            iVar3 = 0;
            SVar4 = kSuccess;
            if (1 < (ulong)(((long)local_e8.
                                   super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_e8.
                                   super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x3333333333333333)) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_f0,__x);
              SVar4 = kAmbiguity;
              iVar3 = 6;
              bVar1 = false;
            }
          }
        }
        else {
          iVar3 = 0;
        }
        if (local_88._M_p != local_78) {
          operator_delete(local_88._M_p);
        }
        std::
        vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ::~vector(&local_e8);
        if (bVar1) goto LAB_001deff1;
      }
      if (local_b0._M_p != local_a0) {
        operator_delete(local_b0._M_p);
      }
      if (iVar3 != 0) goto LAB_001df06c;
      __x = __x + 1;
    } while (__x != local_c0);
  }
  std::
  vector<ot::commissioner::persistent_storage::Domain,std::allocator<ot::commissioner::persistent_storage::Domain>>
  ::
  _M_range_insert<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Domain*,std::vector<ot::commissioner::persistent_storage::Domain,std::allocator<ot::commissioner::persistent_storage::Domain>>>>
            (local_c8,*(undefined8 *)(local_c8 + 8),
             local_108.
             super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_108.
             super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  SVar4 = local_108.
          super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_108.
          super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
          ._M_impl.super__Vector_impl_data._M_start;
LAB_001df06c:
  std::
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ::~vector(&local_108);
  return SVar4;
}

Assistant:

Registry::Status Registry::GetDomainsByAliases(const StringArray &aAliases, DomainArray &aRet, StringArray &aUnresolved)
{
    Registry::Status status;
    DomainArray      domains;

    for (const auto &alias : aAliases)
    {
        Domain dom;

        if (alias == ALIAS_THIS)
        {
            Network nwk;
            status = GetCurrentNetwork(nwk);
            if (status == Registry::Status::kSuccess)
            {
                status = MapStatus(mStorage->Get(nwk.mDomainId, dom));
            }
        }
        else
        {
            DomainArray result;
            Domain      pred;
            pred.mName = alias;
            status     = MapStatus(mStorage->Lookup(pred, result));
            if (status == Registry::Status::kSuccess)
            {
                if (result.size() == 1)
                {
                    dom = result.front();
                }
                else if (result.size() > 1)
                {
                    aUnresolved.push_back(alias);
                    ExitNow(status = Registry::Status::kAmbiguity);
                }
            }
        }
        if (status == Registry::Status::kSuccess)
        {
            domains.push_back(dom);
        }
        else
        {
            aUnresolved.push_back(alias);
        }
    }
    aRet.insert(aRet.end(), domains.begin(), domains.end());
    status = domains.size() > 0 ? Registry::Status::kSuccess : Registry::Status::kNotFound;
exit:
    return status;
}